

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void lj_asm_patchexit(jit_State *J,GCtrace *T,ExitNo exitno,MCode *target)

{
  uint uVar1;
  MCode *pMVar2;
  uint32_t uVar3;
  MCode *ptr;
  MCode *pMVar4;
  long lVar5;
  intptr_t ofs;
  MCode *pMStack_a8;
  uint32_t statei;
  MCode *pgc;
  MCode *pe;
  MCode *px;
  MSize len;
  MCode *mcarea;
  MCode *p;
  MCode *target_local;
  ExitNo exitno_local;
  GCtrace *T_local;
  jit_State *J_local;
  ptrdiff_t delta_1;
  ptrdiff_t delta;
  
  mcarea = T->mcode;
  ptr = lj_mcode_patch(J,mcarea,0);
  uVar1 = T->szmcode;
  pMVar2 = J->exitstubgroup[exitno >> 5];
  pMVar4 = mcarea + ((ulong)uVar1 - 6);
  pMStack_a8 = (MCode *)0x0;
  if (((5 < uVar1) && (mcarea[uVar1 - 5] == 0xe9)) &&
     (mcarea + (long)*(int *)(mcarea + ((ulong)uVar1 - 4)) + ((ulong)uVar1 - 6) ==
      pMVar2 + ((ulong)((exitno & 0x1f) << 2) - 6))) {
    *(uint *)(mcarea + ((ulong)uVar1 - 4)) = (int)target - ((int)mcarea + uVar1);
  }
  for (; (mcarea < pMVar4 &&
         ((lVar5 = (long)(int)(uint)((*mcarea & 0xf0) == 0x40),
          *(int *)(mcarea + lVar5 + 2) != -0xec8 || (mcarea[lVar5] != 199))));
      mcarea = mcarea + uVar3) {
    uVar3 = asm_x86_inslen(mcarea);
  }
  for (; mcarea < pMVar4; mcarea = mcarea + uVar3) {
    if ((((*(ushort *)mcarea & 0xf0ff) == 0x800f) &&
        (mcarea + *(int *)(mcarea + 2) == pMVar2 + ((ulong)((exitno & 0x1f) << 2) - 6))) &&
       (mcarea != pMStack_a8)) {
      *(int *)(mcarea + 2) = (int)target - ((int)mcarea + 6);
    }
    else if ((*mcarea == 0xe8) &&
            ((code *)(mcarea + (long)*(int *)(mcarea + 1) + 5) == lj_gc_step_jit)) {
      pMStack_a8 = mcarea + 7;
    }
    uVar3 = asm_x86_inslen(mcarea);
  }
  lj_mcode_sync(T->mcode,T->mcode + T->szmcode);
  lj_mcode_patch(J,ptr,1);
  return;
}

Assistant:

void lj_asm_patchexit(jit_State *J, GCtrace *T, ExitNo exitno, MCode *target)
{
  MCode *p = T->mcode;
  MCode *mcarea = lj_mcode_patch(J, p, 0);
  MSize len = T->szmcode;
  MCode *px = exitstub_addr(J, exitno) - 6;
  MCode *pe = p+len-6;
  MCode *pgc = NULL;
#if LJ_GC64
  uint32_t statei = (uint32_t)(GG_OFS(g.vmstate) - GG_OFS(dispatch));
#else
  uint32_t statei = u32ptr(&J2G(J)->vmstate);
#endif
  if (len > 5 && p[len-5] == XI_JMP && p+len-6 + *(int32_t *)(p+len-4) == px)
    *(int32_t *)(p+len-4) = jmprel(J, p+len, target);
  /* Do not patch parent exit for a stack check. Skip beyond vmstate update. */
  for (; p < pe; p += asm_x86_inslen(p)) {
    intptr_t ofs = LJ_GC64 ? (p[0] & 0xf0) == 0x40 : LJ_64;
    if (*(uint32_t *)(p+2+ofs) == statei && p[ofs+LJ_GC64-LJ_64] == XI_MOVmi)
      break;
  }
  lj_assertJ(p < pe, "instruction length decoder failed");
  for (; p < pe; p += asm_x86_inslen(p)) {
    if ((*(uint16_t *)p & 0xf0ff) == 0x800f && p + *(int32_t *)(p+2) == px &&
	p != pgc) {
      *(int32_t *)(p+2) = jmprel(J, p+6, target);
    } else if (*p == XI_CALL &&
	      (void *)(p+5+*(int32_t *)(p+1)) == (void *)lj_gc_step_jit) {
      pgc = p+7;  /* Do not patch GC check exit. */
    }
  }
  lj_mcode_sync(T->mcode, T->mcode + T->szmcode);
  lj_mcode_patch(J, mcarea, 1);
}